

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase::testRunStarting(StreamingReporterBase *this,TestRunInfo *_testRunInfo)

{
  Option<Catch::TestRunInfo> OStack_38;
  
  Option<Catch::TestRunInfo>::Option(&OStack_38,_testRunInfo);
  Option<Catch::TestRunInfo>::operator=(&this->testRunInfo,&OStack_38);
  Option<Catch::TestRunInfo>::reset(&OStack_38);
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& _testRunInfo ) {
            testRunInfo = _testRunInfo;
        }